

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O1

void __thiscall QOpenGLTexture::allocateStorage(QOpenGLTexture *this)

{
  QOpenGLTexturePrivate *pQVar1;
  bool bVar2;
  PixelFormat pixelType;
  uint uVar3;
  PixelFormat PVar4;
  QOpenGLTexturePrivate *pQVar5;
  
  pQVar1 = (this->d_ptr).d;
  pQVar5 = pQVar1;
  bVar2 = QOpenGLTexturePrivate::create(pQVar1);
  if (!bVar2) {
    return;
  }
  pixelType = pQVar1->format;
  if ((int)pixelType < 0x8d88) {
    if (0x83ef < (int)pixelType) {
      if ((int)pixelType < 0x8c4c) {
        if (0x88ef < (int)pixelType) {
          switch(pixelType) {
          case 0x8c3a:
          case 0x8c3d:
            goto switchD_00159059_caseD_8051;
          case 0x8c3b:
          case 0x8c3c:
          case 0x8c3e:
          case 0x8c3f:
          case 0x8c40:
          case 0x8c42:
            goto switchD_00158ed0_caseD_8237;
          case 0x8c41:
          case 0x8c43:
            goto switchD_00159059_caseD_8056;
          default:
            goto switchD_0015907c_default;
          }
        }
        if (3 < pixelType - 0x83f0) {
          (*(code *)(&DAT_0018089c + *(int *)(&DAT_0018089c + (ulong)(pixelType - 0x8814) * 4)))();
          return;
        }
      }
      else if ((int)pixelType < 0x8d62) {
        if (0x8cab < (int)pixelType) {
          if (pixelType == 0x8cac) goto switchD_00159059_default;
          if (pixelType != 0x8cad) {
            PVar4 = Stencil;
            goto LAB_001590a8;
          }
switchD_0015907c_default:
          PVar4 = DepthStencil;
          goto LAB_001590a8;
        }
      }
      else {
        switch(pixelType) {
        case 0x8d70:
        case 0x8d76:
        case 0x8d7c:
        case 0x8d82:
          goto switchD_00158f44_caseD_8d70;
        case 0x8d71:
        case 0x8d77:
        case 0x8d7d:
        case 0x8d83:
          goto switchD_00158f44_caseD_8d71;
        case 0x8d72:
        case 0x8d73:
        case 0x8d74:
        case 0x8d75:
        case 0x8d78:
        case 0x8d79:
        case 0x8d7a:
        case 0x8d7b:
        case 0x8d7e:
        case 0x8d7f:
        case 0x8d80:
        case 0x8d81:
          goto switchD_00158ed0_caseD_8237;
        default:
          if (pixelType == 0x8d62) goto switchD_00159059_caseD_8051;
        }
      }
      goto switchD_00159059_caseD_8056;
    }
    if ((int)pixelType < 0x8051) {
      PVar4 = pixelType;
      if (((8 < pixelType - Depth) || ((0x1f1U >> (pixelType - Depth & 0x1f) & 1) == 0)) &&
         (pixelType != NoSourceFormat)) goto switchD_00159059_caseD_8051;
    }
    else {
      switch(pixelType) {
      case 0x8229:
      case 0x822a:
      case 0x822d:
      case 0x822e:
        goto switchD_00158ed0_caseD_8229;
      case 0x822b:
      case 0x822c:
      case 0x822f:
      case 0x8230:
        goto switchD_00158ed0_caseD_822b;
      case 0x8231:
      case 0x8232:
      case 0x8233:
      case 0x8234:
      case 0x8235:
      case 0x8236:
        PVar4 = Red_Integer;
        break;
      case 0x8237:
      case 0x8238:
      case 0x8239:
      case 0x823a:
      case 0x823b:
      case 0x823c:
switchD_00158ed0_caseD_8237:
        PVar4 = RG_Integer;
        break;
      default:
        switch(pixelType) {
        case 0x8051:
        case 0x8054:
          goto switchD_00159059_caseD_8051;
        case 0x8052:
        case 0x8053:
        case 0x8055:
        case 0x8059:
        case 0x805a:
          goto switchD_00158ed0_caseD_8237;
        case 0x8056:
        case 0x8057:
        case 0x8058:
        case 0x805b:
          goto switchD_00159059_caseD_8056;
        default:
switchD_00159059_default:
          PVar4 = Depth;
        }
      }
    }
  }
  else {
    if (0x93af < (int)pixelType) {
      if ((0x3fff00003fffU >> ((ulong)(pixelType - 0x93b0) & 0x3f) & 1) == 0)
      goto switchD_00158ed0_caseD_8237;
      goto switchD_00159059_caseD_8056;
    }
    if ((int)pixelType < 0x8f94) {
      switch(pixelType) {
      case 0x8d88:
      case 0x8d8e:
switchD_00158f44_caseD_8d70:
        PVar4 = RGBA_Integer;
        break;
      case 0x8d89:
      case 0x8d8f:
switchD_00158f44_caseD_8d71:
        PVar4 = RGB_Integer;
        break;
      case 0x8d8a:
      case 0x8d8b:
      case 0x8d8c:
      case 0x8d8d:
        goto switchD_00158ed0_caseD_8237;
      default:
        goto switchD_00159059_caseD_8056;
      }
      goto LAB_001590a8;
    }
    switch(pixelType) {
    case 0x9270:
    case 0x9271:
switchD_00158ed0_caseD_8229:
      PVar4 = Red;
      break;
    case 0x9272:
    case 0x9273:
switchD_00158ed0_caseD_822b:
      PVar4 = RG;
      break;
    case 0x9274:
    case 0x9275:
switchD_00159059_caseD_8051:
      PVar4 = RGB;
      break;
    case 0x9276:
    case 0x9277:
    case 0x9278:
    case 0x9279:
switchD_00159059_caseD_8056:
      PVar4 = RGBA;
      break;
    default:
      switch(pixelType) {
      case 0x8f94:
      case 0x8f98:
        goto switchD_00158ed0_caseD_8229;
      case 0x8f95:
      case 0x8f99:
        goto switchD_00158ed0_caseD_822b;
      case 0x8f96:
      case 0x8f9a:
        goto switchD_00159059_caseD_8051;
      default:
        goto switchD_00159059_caseD_8056;
      }
    }
  }
LAB_001590a8:
  if ((int)pixelType < 0x8d64) {
    if ((int)pixelType < 0x83f0) {
      if (0x81a4 < (int)pixelType) {
        switch(pixelType) {
        case 0x8229:
        case 0x822a:
        case 0x822b:
        case 0x822c:
        case 0x8232:
        case 0x8234:
        case 0x8236:
        case 0x8238:
        case 0x823a:
        case 0x823c:
          goto switchD_0015911d_caseD_8229;
        case 0x822d:
        case 0x822f:
switchD_0015911d_caseD_822d:
          pixelType = 0x140b;
          goto LAB_00159201;
        case 0x822e:
        case 0x8230:
          goto switchD_0015911d_caseD_822e;
        case 0x8231:
        case 0x8233:
        case 0x8235:
        case 0x8237:
        case 0x8239:
        case 0x823b:
          goto switchD_0015911d_caseD_8231;
        default:
          if (1 < pixelType - 0x81a6) {
            pixelType = 0x1403;
            goto LAB_00159201;
          }
LAB_0015922c:
          pixelType = 0x1405;
          goto LAB_00159201;
        }
      }
      if (0x2a0f < (int)pixelType) {
        uVar3 = pixelType - 0x8051;
        if (uVar3 < 0xb) {
          if ((0x489U >> (uVar3 & 0x1f) & 1) != 0) goto switchD_0015911d_caseD_8229;
          if (uVar3 == 5) {
            pixelType = 0x8033;
            goto LAB_00159201;
          }
          if (uVar3 == 6) {
            pixelType = 0x8034;
            goto LAB_00159201;
          }
        }
        pixelType = 0x8032;
        goto LAB_00159201;
      }
      if (4 < pixelType - Alpha) {
        if (pixelType == NoSourceFormat) goto LAB_00159201;
        goto LAB_0015922c;
      }
    }
    else if ((int)pixelType < 0x8c3a) {
      if (0x8813 < (int)pixelType) {
        if (1 < pixelType - 0x8814) {
          if (1 < pixelType - 0x881a) {
            pixelType = 0x84fa;
            goto LAB_00159201;
          }
          goto switchD_0015911d_caseD_822d;
        }
switchD_0015911d_caseD_822e:
        pixelType = 0x1406;
        goto LAB_00159201;
      }
    }
    else {
      if ((int)pixelType < 0x8cac) {
        switch(pixelType - 0x8c3a) {
        case NoSourceFormat:
          pixelType = 0x8c3b;
          break;
        case 1:
        case 2:
        case 4:
        case 5:
        case 6:
        case 8:
          pQVar1 = (QOpenGLTexturePrivate *)pQVar5->q_ptr;
          bVar2 = QOpenGLTexturePrivate::create(pQVar1);
          if (bVar2) {
            QOpenGLTexturePrivate::allocateStorage(pQVar1,PVar4,pixelType - 0x8c3a);
            return;
          }
          return;
        case 3:
          pixelType = 0x8366;
          break;
        default:
          goto switchD_0015911d_caseD_8229;
        }
        goto LAB_00159201;
      }
      if ((int)pixelType < 0x8d48) {
        if (pixelType != 0x8cac) {
          pixelType = 0x8dad;
          goto LAB_00159201;
        }
        goto switchD_0015911d_caseD_822e;
      }
      if (pixelType != 0x8d48) {
        pixelType = 0x8363;
        goto LAB_00159201;
      }
    }
  }
  else if ((int)pixelType < 0x906f) {
    if ((int)pixelType < 0x8dbb) {
      if (((0x30c3000UL >> ((ulong)(pixelType - 0x8d64) & 0x3f) & 1) == 0) &&
         ((0xc30c0000000U >> ((ulong)(pixelType - 0x8d64) & 0x3f) & 1) != 0))
      goto switchD_0015911d_caseD_8231;
    }
    else if (pixelType - 0x8f94 < 8) {
switchD_0015911d_caseD_8231:
      pixelType = 0x1400;
      goto LAB_00159201;
    }
  }
  else if (((0x2d < pixelType - 0x93b0) ||
           ((0x3fff00003fffU >> ((ulong)(pixelType - 0x93b0) & 0x3f) & 1) == 0)) &&
          (9 < pixelType - 0x9270)) {
    pixelType = 0x8036;
    goto LAB_00159201;
  }
switchD_0015911d_caseD_8229:
  pixelType = 0x1401;
LAB_00159201:
  QOpenGLTexturePrivate::allocateStorage(pQVar1,PVar4,pixelType);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }